

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O2

void __thiscall Lib::Array<unsigned_int>::Array(Array<unsigned_int> *this,Array<unsigned_int> *o)

{
  size_t sVar1;
  uint *puVar2;
  uint *puVar3;
  size_t sVar4;
  
  this->_vptr_Array = (_func_int **)&PTR_fillInterval_009e9d38;
  sVar1 = o->_capacity;
  this->_capacity = sVar1;
  if (o->_array == (uint *)0x0) {
    this->_array = (uint *)0x0;
  }
  else {
    puVar3 = (uint *)Lib::alloc(sVar1 << 2);
    this->_array = puVar3;
    sVar1 = this->_capacity;
    puVar2 = o->_array;
    for (sVar4 = 0; sVar1 != sVar4; sVar4 = sVar4 + 1) {
      puVar3[sVar4] = puVar2[sVar4];
    }
  }
  return;
}

Assistant:

Array (const Array &o) : _capacity(o._capacity) {
    if (o._array) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),"Array<>");
      _array = static_cast<C*>(mem);
      for(size_t i=0; i<_capacity; i++) {
        ::new (&_array[i]) C(o._array[i]);
      }
    } else {
      _array = 0;
    }
  }